

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsstm.cpp
# Opt level: O2

CTcObjTemplate * __thiscall
CTcParser::find_template_match
          (CTcParser *this,CTcObjTemplate *first_tpl,CTcObjTemplateInst *src,size_t src_cnt)

{
  int iVar1;
  CTcObjTemplate *tpl;
  
  while( true ) {
    if (first_tpl == (CTcObjTemplate *)0x0) {
      return (CTcObjTemplate *)0x0;
    }
    iVar1 = match_template(this,first_tpl->items_,src,src_cnt);
    if (iVar1 != 0) break;
    first_tpl = first_tpl->nxt_;
  }
  return first_tpl;
}

Assistant:

const CTcObjTemplate *CTcParser::
   find_template_match(const CTcObjTemplate *first_tpl,
                       CTcObjTemplateInst *src, size_t src_cnt)
{

    /* find the matching template */
    for (const CTcObjTemplate *tpl = first_tpl ; tpl != 0 ; tpl = tpl->nxt_)
    {
        /* check for a match */
        if (match_template(tpl->items_, src, src_cnt))
        {
            /* it's a match - return this template */
            return tpl;
        }
    }

    /* we didn't find a match */
    return 0;
}